

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

DWORD * __thiscall MIDIStreamer::WriteStopNotes(MIDIStreamer *this,DWORD *events)

{
  uint local_1c;
  DWORD *pDStack_18;
  int i;
  DWORD *events_local;
  MIDIStreamer *this_local;
  
  pDStack_18 = events;
  for (local_1c = 0; (int)local_1c < 0x10; local_1c = local_1c + 1) {
    *pDStack_18 = 0;
    pDStack_18[1] = 0;
    pDStack_18[2] = local_1c | 0x7bb0;
    pDStack_18[3] = 0;
    pDStack_18[4] = 0;
    pDStack_18[5] = local_1c | 0x79b0;
    pDStack_18 = pDStack_18 + 6;
  }
  return pDStack_18;
}

Assistant:

DWORD *MIDIStreamer::WriteStopNotes(DWORD *events)
{
	for (int i = 0; i < 16; ++i)
	{
		events[0] = 0;				// dwDeltaTime
		events[1] = 0;				// dwStreamID
		events[2] = MIDI_CTRLCHANGE | i | (123 << 8);	// All notes off
		events[3] = 0;
		events[4] = 0;
		events[5] = MIDI_CTRLCHANGE | i | (121 << 8);	// Reset controllers
		events += 6;
	}
	return events;
}